

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

QDockWidget * __thiscall
QDockWidgetGroupWindow::activeTabbedDockWidget(QDockWidgetGroupWindow *this)

{
  int iVar1;
  QDockAreaLayoutInfo *pQVar2;
  const_reference pQVar3;
  qsizetype qVar4;
  QDockAreaLayoutItem *item_1;
  int i_1;
  QDockAreaLayoutItem *item;
  int i;
  QDockAreaLayoutInfo *info;
  QDockWidget *dw;
  QTabBar *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  bool bVar5;
  QDockAreaLayoutInfo *in_stack_ffffffffffffffb8;
  int local_34;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  QDockAreaLayoutInfo *this_00;
  QDockWidget *local_18;
  QDockWidget *local_8;
  
  local_18 = (QDockWidget *)0x0;
  pQVar2 = tabLayoutInfo((QDockWidgetGroupWindow *)
                         CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  if (pQVar2 == (QDockAreaLayoutInfo *)0x0) {
    local_8 = (QDockWidget *)0x0;
  }
  else {
    this_00 = pQVar2;
    if ((pQVar2->tabBar != (QTabBar *)0x0) &&
       (iVar1 = QTabBar::currentIndex(in_stack_ffffffffffffffa8), this_00 = pQVar2, -1 < iVar1)) {
      QTabBar::currentIndex(in_stack_ffffffffffffffa8);
      iVar1 = QDockAreaLayoutInfo::tabIndexToListIndex(this_00,in_stack_ffffffffffffffdc);
      in_stack_ffffffffffffffb8 = pQVar2;
      if ((-1 < iVar1) &&
         (pQVar3 = QList<QDockAreaLayoutItem>::at
                             ((QList<QDockAreaLayoutItem> *)
                              CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                              (qsizetype)in_stack_ffffffffffffffa8),
         in_stack_ffffffffffffffb8 = pQVar2, pQVar3->widgetItem != (QLayoutItem *)0x0)) {
        (*pQVar3->widgetItem->_vptr_QLayoutItem[0xd])();
        local_18 = qobject_cast<QDockWidget*>((QObject *)0x5f07a9);
        in_stack_ffffffffffffffb8 = pQVar2;
      }
    }
    if (local_18 == (QDockWidget *)0x0) {
      local_34 = 0;
      while( true ) {
        bVar5 = false;
        if (local_18 == (QDockWidget *)0x0) {
          in_stack_ffffffffffffffa8 = (QTabBar *)(long)local_34;
          qVar4 = QList<QDockAreaLayoutItem>::size(&this_00->item_list);
          bVar5 = (long)in_stack_ffffffffffffffa8 < qVar4;
        }
        if (bVar5 == false) break;
        pQVar3 = QList<QDockAreaLayoutItem>::at
                           ((QList<QDockAreaLayoutItem> *)CONCAT17(bVar5,in_stack_ffffffffffffffb0),
                            (qsizetype)in_stack_ffffffffffffffa8);
        bVar5 = QDockAreaLayoutItem::skip((QDockAreaLayoutItem *)in_stack_ffffffffffffffb8);
        if ((!bVar5) && (pQVar3->widgetItem != (QLayoutItem *)0x0)) {
          (*pQVar3->widgetItem->_vptr_QLayoutItem[0xd])();
          local_18 = qobject_cast<QDockWidget*>((QObject *)0x5f0862);
        }
        local_34 = local_34 + 1;
      }
    }
    local_8 = local_18;
  }
  return local_8;
}

Assistant:

QDockWidget *QDockWidgetGroupWindow::activeTabbedDockWidget() const
{
    QDockWidget *dw = nullptr;
    const QDockAreaLayoutInfo *info = tabLayoutInfo();
    if (!info)
        return nullptr;
    if (info->tabBar && info->tabBar->currentIndex() >= 0) {
        int i = info->tabIndexToListIndex(info->tabBar->currentIndex());
        if (i >= 0) {
            const QDockAreaLayoutItem &item = info->item_list.at(i);
            if (item.widgetItem)
                dw = qobject_cast<QDockWidget *>(item.widgetItem->widget());
        }
    }
    if (!dw) {
        for (int i = 0; !dw && i < info->item_list.size(); ++i) {
            const QDockAreaLayoutItem &item = info->item_list.at(i);
            if (item.skip())
                continue;
            if (!item.widgetItem)
                continue;
            dw = qobject_cast<QDockWidget *>(item.widgetItem->widget());
        }
    }
    return dw;
}